

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O3

void amrex::RealDescriptor::convertToNativeFloatFormat
               (float *out,Long nitems,istream *is,RealDescriptor *id)

{
  Long *outfor;
  bool bVar1;
  long lVar2;
  void *in;
  RealDescriptor *pRVar3;
  RealDescriptor *ird;
  undefined8 unaff_RBX;
  long lVar4;
  
  lVar2 = (long)readBufferSize;
  if (nitems <= readBufferSize) {
    lVar2 = nitems;
  }
  in = operator_new__((*(id->fr).super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start * 0x20000000 + 0xe0000000 >> 0x20) * lVar2)
  ;
  if (0 < nitems) {
    do {
      lVar2 = (long)readBufferSize;
      if (nitems < readBufferSize) {
        lVar2 = nitems;
      }
      std::istream::read((char *)is,(long)in);
      pRVar3 = FPC::Native32RealDescriptor();
      ird = (RealDescriptor *)FPC::NativeLongDescriptor();
      PD_convert(out,in,lVar2,(int)pRVar3,id,ird,(IntDescriptor *)is,(int)unaff_RBX);
      if (bAlwaysFixDenormals == '\x01') {
        pRVar3 = FPC::Native32RealDescriptor();
        outfor = (pRVar3->fr).super_vector<long,_std::allocator<long>_>.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        pRVar3 = FPC::Native32RealDescriptor();
        PD_fixdenormals(out,lVar2,outfor,
                        (pRVar3->ord).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      out = out + lVar2;
      lVar4 = nitems - lVar2;
      bVar1 = lVar2 <= nitems;
      nitems = lVar4;
    } while (lVar4 != 0 && bVar1);
  }
  if ((*(byte *)((long)&((IntDescriptor *)((long)is + 0x20))->numbytes +
                *(long *)(((IntDescriptor *)is)->numbytes + -0x18)) & 5) != 0) {
    Error_host("convert(Real*,Long,istream&,RealDescriptor&) failed");
  }
  operator_delete__(in);
  return;
}

Assistant:

void
RealDescriptor::convertToNativeFloatFormat (float*                out,
                                            Long                  nitems,
                                            std::istream&         is,
                                            const RealDescriptor& id)
{
//    BL_PROFILE("RD:convertToNativeFloatFormat");

    Long buffSize(std::min(Long(readBufferSize), nitems));
    char *bufr = new char[buffSize * id.numBytes()];

    while (nitems > 0)
    {
        Long get = std::min(static_cast<Long>(readBufferSize), nitems);
        is.read(bufr, id.numBytes()*get);
        PD_convert(out,
                   bufr,
                   get,
                   0,
                   FPC::Native32RealDescriptor(),
                   id,
                   FPC::NativeLongDescriptor());

        if(bAlwaysFixDenormals) {
          PD_fixdenormals(out, get, FPC::Native32RealDescriptor().format(),
                          FPC::Native32RealDescriptor().order());
        }
        nitems -= get;
        out    += get;
    }

    if(is.fail()) {
      amrex::Error("convert(Real*,Long,istream&,RealDescriptor&) failed");
    }

    delete [] bufr;
}